

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O2

void __thiscall
TransitionObservationIndependentMADPDiscrete::~TransitionObservationIndependentMADPDiscrete
          (TransitionObservationIndependentMADPDiscrete *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TransitionObservationIndependentMADPDiscrete::
~TransitionObservationIndependentMADPDiscrete()
{
    // this destructor leaks memory

    vector<MultiAgentDecisionProcessDiscrete*>::iterator it = 
        _m_individualMADPDs.begin();
    vector<MultiAgentDecisionProcessDiscrete*>::iterator last = 
        _m_individualMADPDs.end();
    while(it != last)
    {
        delete *it;//pointer to MultiAgentDecisionProcessDiscrete
        it++;
    }
    _m_individualMADPDs.clear();
    
    vector<JointActionDiscrete*>::iterator it2 = 
        _m_jointActionVec.begin();
    vector<JointActionDiscrete*>::iterator last2 = 
        _m_jointActionVec.end();
    while(it2 != last2)
    {
        delete *it2; //pointer to MultiAgentDecisionProcessDiscrete
        it2++;
    }
    _m_jointActionVec.clear();
}